

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

int threadsTest(char *filename,char *resul,char *err,int options)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  int iVar5;
  xmlThreadParams *__arg;
  ulong uVar6;
  void *result;
  void *local_38;
  
  xmlInitParser();
  iVar1 = 0;
  iVar5 = 0;
  do {
    xmlLoadCatalog("test/threads/complex.xml");
    nb_tests = nb_tests + 1;
    tid[0]._0_4_ = 0xffffffff;
    tid[0]._4_4_ = 0xffffffff;
    tid[1]._0_4_ = 0xffffffff;
    tid[1]._4_4_ = 0xffffffff;
    tid[2]._0_4_ = 0xffffffff;
    tid[2]._4_4_ = 0xffffffff;
    tid[3]._0_4_ = 0xffffffff;
    tid[3]._4_4_ = 0xffffffff;
    tid[4]._0_4_ = 0xffffffff;
    tid[4]._4_4_ = 0xffffffff;
    tid[5]._0_4_ = 0xffffffff;
    tid[5]._4_4_ = 0xffffffff;
    tid[6] = 0xffffffffffffffff;
    __arg = threadParams;
    lVar3 = 0;
    do {
      iVar2 = pthread_create((pthread_t *)((long)tid + lVar3),(pthread_attr_t *)0x0,
                             thread_specific_data,__arg);
      if (iVar2 != 0) {
        threadsTest_cold_1();
        return 1;
      }
      lVar3 = lVar3 + 8;
      __arg = __arg + 1;
    } while (lVar3 != 0x38);
    lVar3 = 0;
    do {
      iVar2 = pthread_join(*(pthread_t *)((long)tid + lVar3),&local_38);
      if (iVar2 != 0) {
        threadsTest_cold_2();
        return 1;
      }
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x38);
    xmlCatalogCleanup();
    piVar4 = &threadParams[0].okay;
    uVar6 = 0;
    do {
      if (*piVar4 == 0) {
        fprintf(_stderr,"Thread %d handling %s failed\n",uVar6 & 0xffffffff,
                ((xmlThreadParams *)(piVar4 + -2))->filename);
        iVar1 = 1;
      }
      uVar6 = uVar6 + 1;
      piVar4 = piVar4 + 4;
    } while (uVar6 != 7);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 500);
  return iVar1;
}

Assistant:

static int
testThread(void)
{
    unsigned int i, repeat;
    int ret;
    int res = 0;

    xmlInitParser();

    for (repeat = 0; repeat < 500; repeat++) {
        xmlLoadCatalog(catalog);
        nb_tests++;

        for (i = 0; i < num_threads; i++) {
            tid[i] = (pthread_t) - 1;
        }

        for (i = 0; i < num_threads; i++) {
            ret = pthread_create(&tid[i], 0, thread_specific_data,
                                 (void *) &threadParams[i]);
            if (ret != 0) {
                fprintf(stderr, "pthread_create failed\n");
                return (1);
            }
        }
        for (i = 0; i < num_threads; i++) {
            void *result;
            ret = pthread_join(tid[i], &result);
            if (ret != 0) {
                fprintf(stderr, "pthread_join failed\n");
                return (1);
            }
        }

        xmlCatalogCleanup();
        for (i = 0; i < num_threads; i++)
            if (threadParams[i].okay == 0) {
                fprintf(stderr, "Thread %d handling %s failed\n",
                        i, threadParams[i].filename);
                res = 1;
            }
    }
    return (res);
}